

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cr_buf_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                    _Bool *peos)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  ulong __n;
  long lVar3;
  _Bool _Var4;
  
  pvVar1 = reader->ctx;
  __n = *(long *)((long)pvVar1 + 0x28) - *(long *)((long)pvVar1 + 0x30);
  if ((__n == 0) || (*(long *)((long)pvVar1 + 0x20) == 0)) {
    *pnread = 0;
    _Var4 = true;
  }
  else {
    if (blen <= __n) {
      __n = blen;
    }
    memcpy(buf,(void *)(*(long *)((long)pvVar1 + 0x20) + *(long *)((long)pvVar1 + 0x30)),__n);
    *pnread = __n;
    lVar3 = __n + *(long *)((long)pvVar1 + 0x30);
    *(long *)((long)pvVar1 + 0x30) = lVar3;
    _Var4 = lVar3 == *(long *)((long)pvVar1 + 0x28);
  }
  *peos = _Var4;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_buf_read(len=%zu) -> 0, nread=%zu, eos=%d",blen,*pnread,(ulong)_Var4);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_buf_read(struct Curl_easy *data,
                            struct Curl_creader *reader,
                            char *buf, size_t blen,
                            size_t *pnread, bool *peos)
{
  struct cr_buf_ctx *ctx = reader->ctx;
  size_t nread = ctx->blen - ctx->index;

  (void)data;
  if(!nread || !ctx->buf) {
    *pnread = 0;
    *peos = TRUE;
  }
  else {
    if(nread > blen)
      nread = blen;
    memcpy(buf, ctx->buf + ctx->index, nread);
    *pnread = nread;
    ctx->index += nread;
    *peos = (ctx->index == ctx->blen);
  }
  CURL_TRC_READ(data, "cr_buf_read(len=%zu) -> 0, nread=%zu, eos=%d",
                blen, *pnread, *peos);
  return CURLE_OK;
}